

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O0

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec2i *a,Vec2i *b,Vec2i *c,Color *ca,Color *cb,Color *cc)

{
  vec<3,float,(glm::qualifier)0> local_5c [8];
  Vec3f c3f;
  Vec3f b3f;
  Vec3f a3f;
  Color *cb_local;
  Color *ca_local;
  Vec2i *c_local;
  Vec2i *b_local;
  Vec2i *a_local;
  BitmapDevice *this_local;
  
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&b3f.field_1,(a->field_0).x,(a->field_1).y,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&c3f.field_1,(b->field_0).x,(b->field_1).y,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            (local_5c,(c->field_0).x,(c->field_1).y,0.0);
  (*(this->super_Device)._vptr_Device[5])(this,&b3f.field_1,&c3f.field_1,local_5c,ca,cb,cc);
  return;
}

Assistant:

void BitmapDevice::Triangle(const Vec2i& a, Vec2i const& b, Vec2i const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  Vec3f a3f{a.x, a.y, 0.f};
  Vec3f b3f{b.x, b.y, 0.f};
  Vec3f c3f{c.x, c.y, 0.f};

  Triangle(a3f, b3f, c3f, ca, cb, cc);
}